

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_test.c
# Opt level: O0

void test_numeric_v6(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  _Bool _Var7;
  uint16_t uVar8;
  nng_err nVar9;
  int iVar10;
  char *pcVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  nng_err result__1;
  nng_err result_;
  nni_resolv_item item;
  nng_sockaddr sa;
  nng_aio *aio;
  
  memset(&result__1,0,0x20);
  _Var7 = has_v6();
  if (_Var7) {
    acutest_message_("IPV6 support present");
    nVar9 = nng_aio_alloc((nng_aio **)(sa.s_storage.sa_pad + 0xf),(_func_void_void_ptr *)0x0,
                          (void *)0x0);
    pcVar11 = nng_strerror(nVar9);
    iVar10 = acutest_check_((uint)(nVar9 == NNG_OK),
                            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                            ,0x75,"%s: expected success, got %s (%d)",
                            "nng_aio_alloc(&aio, NULL, NULL)",pcVar11,nVar9);
    if (iVar10 == 0) {
      acutest_abort_();
    }
    result__1 = NNG_EBUSY;
    item._0_8_ = anon_var_dwarf_48f;
    item.ri_host._0_2_ = 0x50;
    result_._0_1_ = NNG_EINTR;
    item._16_8_ = &item.ri_sa;
    nni_resolv((nni_resolv_item *)&result__1,(nni_aio *)sa.s_storage.sa_pad[0xf]);
    nng_aio_wait((nng_aio *)sa.s_storage.sa_pad[0xf]);
    nVar9 = nng_aio_result((nng_aio *)sa.s_storage.sa_pad[0xf]);
    pcVar11 = nng_strerror(nVar9);
    iVar10 = acutest_check_((uint)(nVar9 == NNG_OK),
                            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                            ,0x7d,"%s: expected success, got %s (%d)","nng_aio_result(aio)",pcVar11,
                            nVar9);
    if (iVar10 == 0) {
      acutest_abort_();
    }
    acutest_check_((uint)((short)item.ri_sa == 4),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                   ,0x7e,"%s","sa.s_in6.sa_family == NNG_AF_INET6");
    uVar8 = nuts_be16(0x50);
    acutest_check_((uint)(item.ri_sa._2_2_ == uVar8),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                   ,0x7f,"%s","sa.s_in6.sa_port == nuts_be16(80)");
    cVar12 = -(item.ri_sa._4_1_ == v6loop[0]);
    cVar13 = -(item.ri_sa._5_1_ == v6loop[1]);
    cVar14 = -(item.ri_sa._6_1_ == v6loop[2]);
    cVar15 = -(item.ri_sa._7_1_ == v6loop[3]);
    cVar16 = -(sa.s_family._0_1_ == v6loop[4]);
    cVar17 = -(sa.s_family._1_1_ == v6loop[5]);
    cVar18 = -(sa.s_ipc.sa_path[0] == v6loop[6]);
    cVar19 = -(sa.s_ipc.sa_path[1] == v6loop[7]);
    cVar20 = -(sa.s_ipc.sa_path[2] == v6loop[8]);
    cVar21 = -(sa.s_ipc.sa_path[3] == v6loop[9]);
    cVar22 = -(sa.s_ipc.sa_path[4] == v6loop[10]);
    cVar23 = -(sa.s_ipc.sa_path[5] == v6loop[0xb]);
    cVar24 = -(sa.s_ipc.sa_path[6] == v6loop[0xc]);
    cVar25 = -(sa.s_ipc.sa_path[7] == v6loop[0xd]);
    cVar26 = -(sa.s_ipc.sa_path[8] == v6loop[0xe]);
    bVar27 = -(sa.s_ipc.sa_path[9] == v6loop[0xf]);
    auVar1[1] = cVar13;
    auVar1[0] = cVar12;
    auVar1[2] = cVar14;
    auVar1[3] = cVar15;
    auVar1[4] = cVar16;
    auVar1[5] = cVar17;
    auVar1[6] = cVar18;
    auVar1[7] = cVar19;
    auVar1[8] = cVar20;
    auVar1[9] = cVar21;
    auVar1[10] = cVar22;
    auVar1[0xb] = cVar23;
    auVar1[0xc] = cVar24;
    auVar1[0xd] = cVar25;
    auVar1[0xe] = cVar26;
    auVar1[0xf] = bVar27;
    auVar2[1] = cVar13;
    auVar2[0] = cVar12;
    auVar2[2] = cVar14;
    auVar2[3] = cVar15;
    auVar2[4] = cVar16;
    auVar2[5] = cVar17;
    auVar2[6] = cVar18;
    auVar2[7] = cVar19;
    auVar2[8] = cVar20;
    auVar2[9] = cVar21;
    auVar2[10] = cVar22;
    auVar2[0xb] = cVar23;
    auVar2[0xc] = cVar24;
    auVar2[0xd] = cVar25;
    auVar2[0xe] = cVar26;
    auVar2[0xf] = bVar27;
    auVar6[1] = cVar15;
    auVar6[0] = cVar14;
    auVar6[2] = cVar16;
    auVar6[3] = cVar17;
    auVar6[4] = cVar18;
    auVar6[5] = cVar19;
    auVar6[6] = cVar20;
    auVar6[7] = cVar21;
    auVar6[8] = cVar22;
    auVar6[9] = cVar23;
    auVar6[10] = cVar24;
    auVar6[0xb] = cVar25;
    auVar6[0xc] = cVar26;
    auVar6[0xd] = bVar27;
    auVar5[1] = cVar16;
    auVar5[0] = cVar15;
    auVar5[2] = cVar17;
    auVar5[3] = cVar18;
    auVar5[4] = cVar19;
    auVar5[5] = cVar20;
    auVar5[6] = cVar21;
    auVar5[7] = cVar22;
    auVar5[8] = cVar23;
    auVar5[9] = cVar24;
    auVar5[10] = cVar25;
    auVar5[0xb] = cVar26;
    auVar5[0xc] = bVar27;
    auVar4[1] = cVar17;
    auVar4[0] = cVar16;
    auVar4[2] = cVar18;
    auVar4[3] = cVar19;
    auVar4[4] = cVar20;
    auVar4[5] = cVar21;
    auVar4[6] = cVar22;
    auVar4[7] = cVar23;
    auVar4[8] = cVar24;
    auVar4[9] = cVar25;
    auVar4[10] = cVar26;
    auVar4[0xb] = bVar27;
    auVar3[1] = cVar18;
    auVar3[0] = cVar17;
    auVar3[2] = cVar19;
    auVar3[3] = cVar20;
    auVar3[4] = cVar21;
    auVar3[5] = cVar22;
    auVar3[6] = cVar23;
    auVar3[7] = cVar24;
    auVar3[8] = cVar25;
    auVar3[9] = cVar26;
    auVar3[10] = bVar27;
    acutest_check_((uint)((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                                   (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                                   (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                                   (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                                   (ushort)((byte)(CONCAT19(bVar27,CONCAT18(cVar26,CONCAT17(cVar25,
                                                  CONCAT16(cVar24,CONCAT15(cVar23,CONCAT14(cVar22,
                                                  CONCAT13(cVar21,CONCAT12(cVar20,CONCAT11(cVar19,
                                                  cVar18))))))))) >> 7) & 1) << 6 |
                                   (ushort)((byte)(CONCAT18(bVar27,CONCAT17(cVar26,CONCAT16(cVar25,
                                                  CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(cVar22,
                                                  CONCAT12(cVar21,CONCAT11(cVar20,cVar19)))))))) >>
                                                  7) & 1) << 7 | (ushort)(bVar27 >> 7) << 0xf) ==
                         0xffff),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                   ,0x80,"%s","memcmp(sa.s_in6.sa_addr, v6loop, 16) == 0");
    nng_aio_free((nng_aio *)sa.s_storage.sa_pad[0xf]);
  }
  return;
}

Assistant:

void
test_numeric_v6(void)
{
	nng_aio        *aio;
	nng_sockaddr    sa;
	nni_resolv_item item = { 0 };

	if (!has_v6()) {
		return;
	}
	NUTS_MSG("IPV6 support present");
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	item.ri_family  = NNG_AF_INET6;
	item.ri_host    = "::1";
	item.ri_port    = 80;
	item.ri_passive = true;
	item.ri_sa      = &sa;
	nni_resolv(&item, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));
	NUTS_TRUE(sa.s_in6.sa_family == NNG_AF_INET6);
	NUTS_TRUE(sa.s_in6.sa_port == nuts_be16(80));
	NUTS_TRUE(memcmp(sa.s_in6.sa_addr, v6loop, 16) == 0);
	nng_aio_free(aio);
}